

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LIF.cpp
# Opt level: O3

void __thiscall LIF::LIF(LIF *this)

{
  LIF_param *pLVar1;
  Logging *pLVar2;
  
  (this->super_Neuron)._vptr_Neuron = (_func_int **)&PTR_update_001269a8;
  pLVar1 = (LIF_param *)operator_new(0x28);
  pLVar1->u_rest = -70.0;
  pLVar1->u_thresh = -50.0;
  pLVar1->tau_rest = 4.0;
  pLVar1->r = 1.0;
  pLVar1->tau = 10.0;
  this->param = pLVar1;
  *(undefined4 *)&this->t_rest = 0;
  *(undefined4 *)((long)&this->t_rest + 4) = 0;
  *(undefined4 *)&this->u = 0;
  *(undefined4 *)((long)&this->u + 4) = 0xc0518000;
  this->i = 0.0;
  this->input = 0.0;
  pLVar2 = Logging::getInstance();
  (this->super_Neuron).logger = pLVar2;
  return;
}

Assistant:

LIF::LIF() : param(new LIF_param) {
    u = param->u_rest;
    t_rest = 0.0;
    i = 0.0;
    initialize();
}